

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_test.cpp
# Opt level: O2

void test_insert(void)

{
  tuple<argo::json_*,_std::default_delete<argo::json>_> this;
  ostream *poVar1;
  allocator local_e9;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> x;
  __uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_> local_c8;
  json local_c0;
  json o;
  
  argo::json::json(&o,object_e);
  std::__cxx11::string::string((string *)&x,"one",&local_e9);
  argo::json::json(&local_c0,1);
  argo::json::insert(&o,(string *)&x,&local_c0);
  argo::json::~json(&local_c0);
  std::__cxx11::string::~string((string *)&x);
  std::__cxx11::string::string((string *)&x,"two",&local_e9);
  argo::json::json(&local_c0,2.123);
  argo::json::insert(&o,(string *)&x,&local_c0);
  argo::json::~json(&local_c0);
  std::__cxx11::string::~string((string *)&x);
  std::__cxx11::string::string((string *)&x,"three",&local_e9);
  argo::json::json(&local_c0,"asfdsad");
  argo::json::insert(&o,(string *)&x,&local_c0);
  argo::json::~json(&local_c0);
  std::__cxx11::string::~string((string *)&x);
  this.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>)operator_new(0x58);
  argo::json::json((json *)this.
                           super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
                           super__Head_base<0UL,_argo::json_*,_false>._M_head_impl,1.23);
  x._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
  super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
       (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
       this.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
       super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
  std::__cxx11::string::string((string *)&local_c0,"four",&local_e9);
  x._M_t.super___uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>._M_t.
  super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       (__uniq_ptr_data<argo::json,_std::default_delete<argo::json>,_true,_true>)
       (__uniq_ptr_impl<argo::json,_std::default_delete<argo::json>_>)0x0;
  local_c8._M_t.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
  super__Head_base<0UL,_argo::json_*,_false>._M_head_impl =
       (tuple<argo::json_*,_std::default_delete<argo::json>_>)
       (tuple<argo::json_*,_std::default_delete<argo::json>_>)
       this.super__Tuple_impl<0UL,_argo::json_*,_std::default_delete<argo::json>_>.
       super__Head_base<0UL,_argo::json_*,_false>._M_head_impl;
  argo::json::insert(&o,(string *)&local_c0,
                     (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_c8);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr
            ((unique_ptr<argo::json,_std::default_delete<argo::json>_> *)&local_c8);
  std::__cxx11::string::~string((string *)&local_c0);
  poVar1 = argo::operator<<((ostream *)jlog,&o);
  std::endl<char,std::char_traits<char>>(poVar1);
  std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&x);
  argo::json::~json(&o);
  return;
}

Assistant:

void test_insert()
{
    json o(json::object_e);

    o.insert("one", 1);
    o.insert("two", 2.123);
    o.insert("three", "asfdsad");
    unique_ptr<json> x(new json(1.23));
    o.insert("four", move(x));

    jlog << o << endl;
}